

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicDate(JSContext *ctx)

{
  long in_RDI;
  JSValue JVar1;
  JSValue JVar2;
  JSValue obj;
  long lVar3;
  int length;
  undefined1 in_stack_ffffffffffffffc8 [16];
  JSValueUnion ctx_00;
  JSValueUnion JVar4;
  int64_t in_stack_ffffffffffffffe8;
  
  lVar3 = *(long *)(in_RDI + 0x40);
  JVar1 = JS_NewObject((JSContext *)0x11f0c1);
  ctx_00 = JVar1.u;
  JVar4 = (JSValueUnion)JVar1.tag;
  ((JSValueUnion *)(lVar3 + 0xa0))->ptr = (void *)ctx_00;
  ((JSValueUnion *)(lVar3 + 0xa8))->ptr = (void *)JVar4;
  JS_SetPropertyFunctionList
            (in_stack_ffffffffffffffc8._8_8_,JVar1,in_stack_ffffffffffffffc8._0_8_,
             (int)((ulong)lVar3 >> 0x20));
  length = (int)((ulong)lVar3 >> 0x20);
  JVar2.tag = in_stack_ffffffffffffffe8;
  JVar2.u.ptr = JVar4.ptr;
  JVar2 = JS_NewGlobalCConstructor
                    ((JSContext *)ctx_00.ptr,in_stack_ffffffffffffffc8._8_8_,
                     in_stack_ffffffffffffffc8._0_8_,length,JVar2);
  JVar1.tag = (int64_t)JVar4.ptr;
  JVar1.u.ptr = ctx_00.ptr;
  JS_SetPropertyFunctionList
            ((JSContext *)JVar2.tag,JVar1,(JSCFunctionListEntry *)JVar2.u.ptr,length);
  return;
}

Assistant:

void JS_AddIntrinsicDate(JSContext *ctx)
{
    JSValueConst obj;

    /* Date */
    ctx->class_proto[JS_CLASS_DATE] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATE], js_date_proto_funcs,
                               countof(js_date_proto_funcs));
    obj = JS_NewGlobalCConstructor(ctx, "Date", js_date_constructor, 7,
                                   ctx->class_proto[JS_CLASS_DATE]);
    JS_SetPropertyFunctionList(ctx, obj, js_date_funcs, countof(js_date_funcs));
}